

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q3a_heap_node_relation.cpp
# Opt level: O0

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  int local_1c;
  int local_18;
  int b;
  int a;
  int n;
  int m;
  
  n = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&a);
  std::istream::operator>>(piVar1,&b);
  while (b != 0) {
    b = b + -1;
    piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_18);
    std::istream::operator>>(piVar1,&local_1c);
    if (local_18 == local_1c) {
      poVar2 = std::operator<<((ostream *)&std::cout,"a and b are the same node");
      std::operator<<(poVar2,"\n");
    }
    else if (local_1c < local_18) {
      for (; local_1c < local_18; local_18 = (local_18 + -1) / 2) {
      }
      if (local_1c == local_18) {
        poVar2 = std::operator<<((ostream *)&std::cout,"b is an ancestor of a");
        std::operator<<(poVar2,"\n");
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"a and b are not related");
        std::operator<<(poVar2,"\n");
      }
    }
    else if (local_18 < local_1c) {
      for (; local_18 < local_1c; local_1c = (local_1c + -1) / 2) {
      }
      if (local_1c == local_18) {
        poVar2 = std::operator<<((ostream *)&std::cout,"a is an ancestor of b");
        std::operator<<(poVar2,"\n");
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"a and b are not related");
        std::operator<<(poVar2,"\n");
      }
    }
  }
  return n;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int m, n;
    cin >> m >> n;
    while (n--) {
        int a,b;
        cin >> a >> b;
        if (a == b) {
            cout << "a and b are the same node" << endl;
        } else if (a > b) {
            while (a > b) {
                a = (a - 1) / 2;
            }
            if (b == a)
                cout << "b is an ancestor of a" << endl;
            else
                cout << "a and b are not related" << endl;
        } else if (a < b) {
            while (b > a) {
                b = (b - 1) / 2;
            }
            if (b == a)
                cout << "a is an ancestor of b" << endl;
            else
                cout << "a and b are not related" << endl;
        }
    }
}